

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::BuiltinVariableShader::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,BuiltinVariableShader *this,ContextType *contextType,
          VariableTest test)

{
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream buf;
  VariableTest test_local;
  ContextType *contextType_local;
  BuiltinVariableShader *this_local;
  
  buf._372_4_ = test;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}");
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,"#extension GL_EXT_geometry_point_size : require\n");
  }
  std::operator<<((ostream *)local_1a0,"layout(points) in;\n");
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,"layout(points, max_vertices = 1) out;\n");
  }
  else {
    std::operator<<((ostream *)local_1a0,"layout(triangle_strip, max_vertices = 3) out;\n");
  }
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,"in highp vec4 v_geom_pointSize[];\n");
  }
  else if (buf._372_4_ == 2) {
    std::operator<<((ostream *)local_1a0,"in highp vec4 v_geom_primitiveID[];\n");
  }
  if (buf._372_4_ != 2) {
    std::operator<<((ostream *)local_1a0,"out highp vec4 v_frag_FragColor;\n");
  }
  std::operator<<((ostream *)local_1a0,"\nvoid main (void)\n{\n");
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,
                    "\tgl_Position = gl_in[0].gl_Position;\n\tgl_PointSize = v_geom_pointSize[0].x + 1.0;\n\tv_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\tEmitVertex();\n"
                   );
  }
  else if (buf._372_4_ == 1) {
    std::operator<<((ostream *)local_1a0,
                    "\tconst highp vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 colors[4] = vec4[4](red, green, blue, yellow);\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n"
                   );
  }
  else if (buf._372_4_ == 2) {
    std::operator<<((ostream *)local_1a0,
                    "\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n"
                   );
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1d0,contextType);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltinVariableShader::genGeometrySource (const glu::ContextType& contextType, VariableTest test) const
{
	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_GEOMETRY_SHADER}";

	if (test == TEST_POINT_SIZE)
		buf << "#extension GL_EXT_geometry_point_size : require\n";

	buf << "layout(points) in;\n";

	if (test == TEST_POINT_SIZE)
		buf << "layout(points, max_vertices = 1) out;\n";
	else
		buf << "layout(triangle_strip, max_vertices = 3) out;\n";

	if (test == TEST_POINT_SIZE)
		buf << "in highp vec4 v_geom_pointSize[];\n";
	else if (test == TEST_PRIMITIVE_ID)
		buf << "in highp vec4 v_geom_primitiveID[];\n";

	if (test != TEST_PRIMITIVE_ID)
		buf << "out highp vec4 v_frag_FragColor;\n";

	buf <<	"\n"
			"void main (void)\n"
			"{\n";

	if (test == TEST_POINT_SIZE)
	{
		buf <<	"	gl_Position = gl_in[0].gl_Position;\n"
				"	gl_PointSize = v_geom_pointSize[0].x + 1.0;\n"
				"	v_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
				"	EmitVertex();\n";
	}
	else if (test == TEST_PRIMITIVE_ID_IN)
	{
		buf <<	"	const highp vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"	const highp vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				"	const highp vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n"
				"	const highp vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				"	const highp vec4 colors[4] = vec4[4](red, green, blue, yellow);\n"
				"\n"
				"	gl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n"
				"	v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
				"	EmitVertex();\n"
				"\n"
				"	gl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n"
				"	v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
				"	EmitVertex();\n"
				"\n"
				"	gl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n"
				"	v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
				"	EmitVertex();\n";
	}
	else if (test == TEST_PRIMITIVE_ID)
	{
		buf <<	"	gl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n"
				"	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
				"	EmitVertex();\n"
				"\n"
				"	gl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n"
				"	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
				"	EmitVertex();\n"
				"\n"
				"	gl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n"
				"	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
				"	EmitVertex();\n"
				"\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	buf << "}\n";

	return specializeShader(buf.str(), contextType);
}